

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O0

size_type __thiscall absl::string_view::find_first_not_of(string_view *this,char c,size_type pos)

{
  bool bVar1;
  ulong local_28;
  size_type pos_local;
  char c_local;
  string_view *this_local;
  
  bVar1 = empty(this);
  local_28 = pos;
  if (!bVar1) {
    for (; local_28 < this->length_; local_28 = local_28 + 1) {
      if (this->ptr_[local_28] != c) {
        return local_28;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

string_view::size_type string_view::find_first_not_of(char c,
                                                      size_type pos) const
    noexcept {
  if (empty()) return npos;
  for (; pos < length_; ++pos) {
    if (ptr_[pos] != c) {
      return pos;
    }
  }
  return npos;
}